

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_operator.cpp
# Opt level: O1

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformAExprInternal(Transformer *this,PGAExpr *root)

{
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var1;
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var2;
  ParserOptions *pPVar3;
  long lVar4;
  undefined8 uVar5;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var6;
  _Head_base<0UL,_duckdb::SelectNode_*,_false> _Var7;
  ExpressionType EVar8;
  int iVar9;
  __uniq_ptr_impl<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>_>
  this_00;
  SelectNode *this_01;
  pointer pSVar10;
  _Head_base<0UL,_duckdb::TableRef_*,_false> _Var11;
  pointer pSVar12;
  pointer pSVar13;
  type expr;
  undefined1 this_02 [8];
  BaseExpression *pBVar14;
  FunctionExpression *pFVar15;
  reference pvVar16;
  pointer pPVar17;
  ConstantExpression *pCVar18;
  Transformer *pTVar19;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> _Var20;
  InternalException *this_03;
  ParserException *this_04;
  NotImplementedException *pNVar21;
  long in_RDX;
  pointer *__ptr;
  PGAExpr *op;
  string *op_00;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var22;
  Transformer *pTVar23;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  *this_05;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  right_expr;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  left_expr_1;
  templated_unique_single_t select_statement;
  templated_unique_single_t subquery_expr;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  left_expr;
  unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
  right_expr_1;
  vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
  children_2;
  templated_unique_single_t select_node;
  string name;
  undefined1 local_118 [16];
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_108;
  undefined1 local_100 [8];
  undefined1 local_f8 [32];
  undefined1 local_d8 [40];
  _Head_base<0UL,_duckdb::SelectNode_*,_false> local_b0;
  Transformer *local_a8;
  __node_base local_a0;
  __node_base local_98;
  __node_base local_90;
  undefined1 local_88 [16];
  undefined1 local_78 [40];
  pointer ppCStack_50;
  undefined1 local_48 [32];
  
  local_d8._0_8_ = **(undefined8 **)(*(long *)(in_RDX + 8) + 8);
  optional_ptr<duckdb_libpgquery::PGValue,_true>::CheckValid
            ((optional_ptr<duckdb_libpgquery::PGValue,_true> *)local_d8);
  ::std::__cxx11::string::string
            ((string *)local_88,(char *)((ValUnion *)(local_d8._0_8_ + 8))->str,
             (allocator *)local_f8);
  switch(*(undefined4 *)(in_RDX + 4)) {
  case 1:
  case 2:
    TransformExpression((Transformer *)(local_118 + 8),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    TransformExpression((Transformer *)(local_f8 + 0x18),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    this_00._M_t.
    super__Tuple_impl<0UL,_duckdb::SubqueryExpression_*,_std::default_delete<duckdb::SubqueryExpression>_>
    .super__Head_base<0UL,_duckdb::SubqueryExpression_*,_false>._M_head_impl =
         (tuple<duckdb::SubqueryExpression_*,_std::default_delete<duckdb::SubqueryExpression>_>)
         operator_new(0x58);
    SubqueryExpression::SubqueryExpression
              ((SubqueryExpression *)
               this_00._M_t.
               super__Tuple_impl<0UL,_duckdb::SubqueryExpression_*,_std::default_delete<duckdb::SubqueryExpression>_>
               .super__Head_base<0UL,_duckdb::SubqueryExpression_*,_false>._M_head_impl);
    local_100 = (undefined1  [8])
                this_00._M_t.
                super__Tuple_impl<0UL,_duckdb::SubqueryExpression_*,_std::default_delete<duckdb::SubqueryExpression>_>
                .super__Head_base<0UL,_duckdb::SubqueryExpression_*,_false>._M_head_impl;
    local_108._M_head_impl = (SelectStatement *)operator_new(0x80);
    ((local_108._M_head_impl)->super_SQLStatement).type = SELECT_STATEMENT;
    ((local_108._M_head_impl)->super_SQLStatement).stmt_location = 0;
    ((local_108._M_head_impl)->super_SQLStatement).stmt_length = 0;
    ((local_108._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_buckets =
         &((local_108._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_single_bucket;
    ((local_108._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_bucket_count = 1;
    ((local_108._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)0x0;
    ((local_108._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_element_count = 0;
    ((local_108._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_rehash_policy.
    _M_max_load_factor = 1.0;
    ((local_108._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_rehash_policy.
    _M_next_resize = 0;
    ((local_108._M_head_impl)->super_SQLStatement).named_param_map._M_h._M_single_bucket =
         (__node_base_ptr)0x0;
    ((local_108._M_head_impl)->super_SQLStatement).query._M_dataplus._M_p =
         (pointer)&((local_108._M_head_impl)->super_SQLStatement).query.field_2;
    ((local_108._M_head_impl)->super_SQLStatement).query._M_string_length = 0;
    ((local_108._M_head_impl)->super_SQLStatement).query.field_2._M_local_buf[0] = '\0';
    ((local_108._M_head_impl)->super_SQLStatement)._vptr_SQLStatement =
         (_func_int **)&PTR__SelectStatement_019b1ba8;
    ((local_108._M_head_impl)->node).
    super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = (QueryNode *)0x0;
    this_01 = (SelectNode *)operator_new(0xf0);
    SelectNode::SelectNode(this_01);
    local_f8._0_8_ =
         (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)0x0;
    local_f8._8_8_ = (_Hash_node_base *)0x0;
    local_f8._16_8_ = (pointer)0x0;
    local_b0._M_head_impl = this_01;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)local_f8,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_f8 + 0x18));
    pSVar10 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_b0);
    make_uniq<duckdb::FunctionExpression,char_const(&)[7],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)local_118,(char (*) [7])0x135173d,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)local_f8);
    local_d8._0_8_ = local_118._0_8_;
    local_118._0_8_ = (Transformer *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pSVar10->select_list,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_d8);
    if ((Transformer *)local_d8._0_8_ != (Transformer *)0x0) {
      (*(((ParsedExpression *)local_d8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    local_d8._0_8_ = (Transformer *)0x0;
    if ((Transformer *)local_118._0_8_ != (Transformer *)0x0) {
      (*(((ParsedExpression *)local_118._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    _Var11._M_head_impl = (TableRef *)operator_new(0x68);
    (_Var11._M_head_impl)->type = EMPTY_FROM;
    ((_Var11._M_head_impl)->alias)._M_dataplus =
         (_Alloc_hider)&((_Var11._M_head_impl)->alias).field_2;
    ((_Var11._M_head_impl)->alias)._M_string_length = 0;
    ((_Var11._M_head_impl)->alias).field_2._M_local_buf[0] = '\0';
    ((_Var11._M_head_impl)->sample).
    super_unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_> =
         (unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>_>)0x0;
    ((_Var11._M_head_impl)->query_location).index = 0xffffffffffffffff;
    *(undefined8 *)&((_Var11._M_head_impl)->external_dependency).internal = 0;
    ((_Var11._M_head_impl)->external_dependency).internal.
    super___shared_ptr<duckdb::ExternalDependency,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    *(undefined8 *)
     &((_Var11._M_head_impl)->column_name_alias).
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         = 0;
    ((_Var11._M_head_impl)->column_name_alias).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ((_Var11._M_head_impl)->column_name_alias).
    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (_Var11._M_head_impl)->_vptr_TableRef = (_func_int **)&PTR__TableRef_019b2120;
    pSVar10 = unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>::
              operator->((unique_ptr<duckdb::SelectNode,_std::default_delete<duckdb::SelectNode>,_true>
                          *)&local_b0);
    _Var1._M_head_impl =
         (pSVar10->from_table).
         super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
         super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl;
    (pSVar10->from_table).super_unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>
    ._M_t.super___uniq_ptr_impl<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::TableRef_*,_std::default_delete<duckdb::TableRef>_>.
    super__Head_base<0UL,_duckdb::TableRef_*,_false>._M_head_impl = _Var11._M_head_impl;
    if (_Var1._M_head_impl != (TableRef *)0x0) {
      (**(code **)((long)(_Var1._M_head_impl)->_vptr_TableRef + 8))();
    }
    _Var7._M_head_impl = local_b0._M_head_impl;
    local_b0._M_head_impl = (SelectNode *)0x0;
    pSVar12 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                            *)&local_108);
    _Var2._M_head_impl =
         (pSVar12->node).
         super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
         super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
    (pSVar12->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
    _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
    super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl =
         &(_Var7._M_head_impl)->super_QueryNode;
    if (_Var2._M_head_impl != (QueryNode *)0x0) {
      (**(code **)((long)(_Var2._M_head_impl)->_vptr_QueryNode + 8))();
    }
    pSVar13 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)local_100);
    _Var6._M_head_impl = local_108._M_head_impl;
    local_108._M_head_impl = (SelectStatement *)0x0;
    _Var20._M_head_impl =
         (pSVar13->subquery).
         super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
         .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl;
    (pSVar13->subquery).
    super_unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>._M_t.
    super___uniq_ptr_impl<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::SelectStatement_*,_std::default_delete<duckdb::SelectStatement>_>
    .super__Head_base<0UL,_duckdb::SelectStatement_*,_false>._M_head_impl = _Var6._M_head_impl;
    if (_Var20._M_head_impl != (SelectStatement *)0x0) {
      (**(code **)(*(long *)&(_Var20._M_head_impl)->super_SQLStatement + 8))();
    }
    pSVar13 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)local_100);
    pSVar13->subquery_type = ANY;
    pSVar13 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)local_100);
    uVar5 = local_118._8_8_;
    local_118._8_8_ = (Transformer *)0x0;
    _Var22._M_head_impl =
         (pSVar13->child).
         super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
         .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
    (pSVar13->child).
    super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
    super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
    .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl =
         (ParsedExpression *)uVar5;
    if (_Var22._M_head_impl != (ParsedExpression *)0x0) {
      (**(code **)(*(long *)&(_Var22._M_head_impl)->super_BaseExpression + 8))();
    }
    EVar8 = OperatorToExpressionType((string *)local_88);
    pSVar13 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)local_100);
    pSVar13->comparison_type = EVar8;
    expr = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
           ::operator*((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                        *)local_100);
    SetQueryLocation(&expr->super_ParsedExpression,*(int *)(in_RDX + 0x20));
    pSVar13 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
              ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                            *)local_100);
    this_02 = local_100;
    if (pSVar13->comparison_type == INVALID) {
      this_04 = (ParserException *)__cxa_allocate_exception(0x10);
      local_d8._0_8_ = local_d8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"Unsupported comparison \"%s\" for ANY/ALL subquery","");
      local_48._0_8_ = local_48 + 0x10;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)local_48,local_88._0_8_,(pointer)(local_88._0_8_ + local_88._8_8_));
      ParserException::ParserException<std::__cxx11::string>
                (this_04,(string *)local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
      __cxa_throw(this_04,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    if (*(int *)(in_RDX + 4) == 2) {
      pSVar13 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                              *)local_100);
      EVar8 = NegateComparisonExpression(pSVar13->comparison_type);
      pSVar13 = unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                ::operator->((unique_ptr<duckdb::SubqueryExpression,_std::default_delete<duckdb::SubqueryExpression>,_true>
                              *)local_100);
      pSVar13->comparison_type = EVar8;
      this_02 = (undefined1  [8])operator_new(0x50);
      local_d8._0_8_ = local_100;
      local_100 = (undefined1  [8])0x0;
      local_118._0_8_ = (Transformer *)0x0;
      OperatorExpression::OperatorExpression
                ((OperatorExpression *)this_02,OPERATOR_NOT,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_d8,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_118);
      if ((Transformer *)local_118._0_8_ != (Transformer *)0x0) {
        (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_118._0_8_)->ptr->options)();
      }
      local_118._0_8_ = (Transformer *)0x0;
      if ((Transformer *)local_d8._0_8_ != (Transformer *)0x0) {
        (*(((ParsedExpression *)local_d8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
    }
    else {
      local_100 = (undefined1  [8])0x0;
    }
    (this->parent).ptr = (Transformer *)this_02;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)local_f8);
    if (local_b0._M_head_impl != (SelectNode *)0x0) {
      (*(code *)((_Hash_node_base *)((local_b0._M_head_impl)->super_QueryNode)._vptr_QueryNode)[1].
                _M_nxt)();
    }
    break;
  case 3:
    TransformExpression((Transformer *)local_118,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    TransformExpression((Transformer *)(local_118 + 8),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    pTVar19 = (Transformer *)operator_new(0x48);
    local_d8._0_8_ = local_118._0_8_;
    local_118._0_8_ = (Transformer *)0x0;
    local_f8._0_8_ = local_118._8_8_;
    local_118._8_8_ = (Transformer *)0x0;
    ComparisonExpression::ComparisonExpression
              ((ComparisonExpression *)pTVar19,COMPARE_DISTINCT_FROM,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_d8,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_f8);
    goto LAB_00cbf898;
  case 4:
    TransformExpression((Transformer *)local_118,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    TransformExpression((Transformer *)(local_118 + 8),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    pTVar19 = (Transformer *)operator_new(0x48);
    local_d8._0_8_ = local_118._0_8_;
    local_118._0_8_ = (Transformer *)0x0;
    local_f8._0_8_ = local_118._8_8_;
    local_118._8_8_ = (Transformer *)0x0;
    ComparisonExpression::ComparisonExpression
              ((ComparisonExpression *)pTVar19,COMPARE_BOUNDARY_END,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_d8,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_f8);
LAB_00cbf898:
    if ((_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)local_f8._0_8_ !=
        (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0) {
      (*((BaseExpression *)&((BaseExpression *)local_f8._0_8_)->_vptr_BaseExpression)->
        _vptr_BaseExpression[1])();
    }
    local_f8._0_8_ = (ParsedExpression *)0x0;
    if ((Transformer *)local_d8._0_8_ != (Transformer *)0x0) {
      (*(((ParsedExpression *)local_d8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
    }
    (this->parent).ptr = pTVar19;
    _Var22._M_head_impl = (ParsedExpression *)local_118._0_8_;
    if ((Transformer *)local_118._8_8_ != (Transformer *)0x0) {
      (*(((ParsedExpression *)local_118._8_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
      _Var22._M_head_impl = (ParsedExpression *)local_118._0_8_;
    }
    goto LAB_00cbfba4;
  case 5:
    local_d8._0_8_ = (Transformer *)0x0;
    local_d8._8_8_ = (__node_base_ptr)0x0;
    local_d8._16_8_ = (pointer)0x0;
    TransformExpression((Transformer *)local_f8,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root)
    ;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)local_d8,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_f8);
    if ((Transformer *)local_f8._0_8_ != (Transformer *)0x0) {
      (*((BaseExpression *)&((BaseExpression *)local_f8._0_8_)->_vptr_BaseExpression)->
        _vptr_BaseExpression[1])();
    }
    TransformExpression((Transformer *)local_f8,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root)
    ;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)local_d8,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_f8);
    if ((Transformer *)local_f8._0_8_ != (Transformer *)0x0) {
      (*((BaseExpression *)&((BaseExpression *)local_f8._0_8_)->_vptr_BaseExpression)->
        _vptr_BaseExpression[1])();
    }
    make_uniq<duckdb::FunctionExpression,char_const(&)[7],duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)local_f8,(char (*) [7])"nullif",
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)local_d8);
    uVar5 = local_f8._0_8_;
    local_f8._0_8_ =
         (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)0x0;
    (this->parent).ptr = (Transformer *)uVar5;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)local_d8);
    goto LAB_00cbfbaf;
  default:
    TransformExpression((Transformer *)local_f8,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root)
    ;
    op = root;
    TransformExpression((Transformer *)local_118,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    if ((Transformer *)local_f8._0_8_ == (Transformer *)0x0) {
      local_90._M_nxt = (_Hash_node_base *)local_118._0_8_;
      local_118._0_8_ = (Transformer *)0x0;
      TransformUnaryOperator
                (this,(string *)op,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_88);
      if ((Transformer *)local_90._M_nxt != (Transformer *)0x0) {
        (*(((ParsedExpression *)&(local_90._M_nxt)->_M_nxt)->super_BaseExpression).
          _vptr_BaseExpression[1])();
      }
      local_90._M_nxt = (__node_base_ptr)0x0;
    }
    else {
      if ((Transformer *)local_118._0_8_ == (Transformer *)0x0) {
        pTVar19 = (Transformer *)(local_d8 + 0x10);
        local_d8._0_8_ = pTVar19;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)local_d8,local_88._0_8_,
                   (pointer)((long)&(((unique_ptr<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
                                       *)local_88._8_8_)->_M_t).
                                    super___uniq_ptr_impl<duckdb::Transformer::CreatePivotEntry,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_duckdb::Transformer::CreatePivotEntry_*,_std::default_delete<duckdb::Transformer::CreatePivotEntry>_>
                                    .
                                    super__Head_base<0UL,_duckdb::Transformer::CreatePivotEntry_*,_false>
                                    ._M_head_impl + local_88._0_8_));
        op_00 = (string *)0x13bb1ac;
        ::std::__cxx11::string::append(local_d8);
        local_98._M_nxt = (_Hash_node_base *)local_f8._0_8_;
        local_f8._0_8_ =
             (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
              )0x0;
        TransformUnaryOperator
                  (this,op_00,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)local_d8);
        if ((Transformer *)local_98._M_nxt != (Transformer *)0x0) {
          (*(((ParsedExpression *)&(local_98._M_nxt)->_M_nxt)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        local_98._M_nxt = (_Hash_node_base *)0x0;
        pTVar23 = (Transformer *)local_d8._0_8_;
      }
      else {
        pTVar19 = (Transformer *)(local_78 + 0x20);
        if ((Transformer *)local_88._0_8_ == (Transformer *)(local_88 + 0x10)) {
          ppCStack_50 = (pointer)local_78._8_8_;
          local_78._16_8_ = pTVar19;
        }
        else {
          local_78._16_8_ = local_88._0_8_;
        }
        local_78._24_8_ = local_88._8_8_;
        local_88._8_8_ = (PGList *)0x0;
        local_78[0] = '\0';
        local_a0._M_nxt = (_Hash_node_base *)local_f8._0_8_;
        local_f8._0_8_ =
             (__uniq_ptr_data<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true,_true>
              )0x0;
        local_a8 = (Transformer *)local_118._0_8_;
        local_118._0_8_ = (Transformer *)0x0;
        local_88._0_8_ = (Transformer *)(local_88 + 0x10);
        TransformBinaryOperator
                  (this,(string *)root,
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)(local_78 + 0x10),
                   (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                    *)&local_a0);
        if (local_a8 != (Transformer *)0x0) {
          (*(((ParsedExpression *)&local_a8->parent)->super_BaseExpression)._vptr_BaseExpression[1])
                    ();
        }
        local_a8 = (Transformer *)0x0;
        if ((Transformer *)local_a0._M_nxt != (Transformer *)0x0) {
          (*(((ParsedExpression *)&(local_a0._M_nxt)->_M_nxt)->super_BaseExpression).
            _vptr_BaseExpression[1])();
        }
        local_a0._M_nxt = (_Hash_node_base *)0x0;
        pTVar23 = (Transformer *)local_78._16_8_;
      }
      if (pTVar23 != pTVar19) {
        operator_delete(pTVar23);
      }
    }
    _Var22._M_head_impl = (ParsedExpression *)local_f8._0_8_;
    if ((Transformer *)local_118._0_8_ != (Transformer *)0x0) {
      (*(((ParsedExpression *)local_118._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
      _Var22._M_head_impl = (ParsedExpression *)local_f8._0_8_;
    }
    goto LAB_00cbfba4;
  case 7:
    TransformInExpression(this,(string *)root,(PGAExpr *)local_88);
    goto LAB_00cbfbaf;
  case 0xb:
    TransformExpression((Transformer *)(local_118 + 8),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    TransformExpression((Transformer *)(local_f8 + 0x18),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    local_f8._0_8_ =
         (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)0x0;
    local_f8._8_8_ = (_Hash_node_base *)0x0;
    local_f8._16_8_ = (pointer)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)local_f8,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_118 + 8));
    pBVar14 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                             *)(local_f8 + 0x18))->super_BaseExpression;
    pFVar15 = BaseExpression::Cast<duckdb::FunctionExpression>(pBVar14);
    this_05 = &pFVar15->children;
    pvVar16 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[](this_05,1);
    pPVar17 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              ::operator->(pvVar16);
    if ((pPVar17->super_BaseExpression).type != VALUE_CONSTANT) {
      pNVar21 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_d8._0_8_ = local_d8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"Custom escape in SIMILAR TO","");
      NotImplementedException::NotImplementedException(pNVar21,(string *)local_d8);
      __cxa_throw(pNVar21,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar16 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[](this_05,1);
    pBVar14 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
               ::operator->(pvVar16)->super_BaseExpression;
    pCVar18 = BaseExpression::Cast<duckdb::ConstantExpression>(pBVar14);
    if ((pCVar18->value).is_null == false) {
      pNVar21 = (NotImplementedException *)__cxa_allocate_exception(0x10);
      local_d8._0_8_ = local_d8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"Custom escape in SIMILAR TO","");
      NotImplementedException::NotImplementedException(pNVar21,(string *)local_d8);
      __cxa_throw(pNVar21,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pvVar16 = vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
              ::operator[](this_05,0);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)local_f8,pvVar16);
    iVar9 = ::std::__cxx11::string::compare(local_88);
    local_100 = (undefined1  [8])0x133884e;
    make_uniq<duckdb::FunctionExpression,char_const*const&,duckdb::vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,true>>
              ((duckdb *)&local_108,(char **)local_100,
               (vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_true>
                *)local_f8);
    _Var20._M_head_impl = local_108._M_head_impl;
    if (iVar9 == 0) {
      _Var20._M_head_impl = (SelectStatement *)operator_new(0x50);
      local_d8._0_8_ = local_108._M_head_impl;
      local_108._M_head_impl = (SelectStatement *)0x0;
      local_118._0_8_ = (Transformer *)0x0;
      OperatorExpression::OperatorExpression
                ((OperatorExpression *)_Var20._M_head_impl,OPERATOR_NOT,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_d8,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_118);
      if ((Transformer *)local_118._0_8_ != (Transformer *)0x0) {
        (*(code *)((optional_ptr<duckdb::Transformer,_true> *)local_118._0_8_)->ptr->options)();
      }
      local_118._0_8_ = (Transformer *)0x0;
      if ((Transformer *)local_d8._0_8_ != (Transformer *)0x0) {
        (*(((ParsedExpression *)local_d8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
    }
    else {
      local_108._M_head_impl = (SelectStatement *)0x0;
    }
    (this->parent).ptr = (Transformer *)_Var20._M_head_impl;
    if ((Transformer *)local_108._M_head_impl != (Transformer *)0x0) {
      (*((BaseExpression *)&((local_108._M_head_impl)->super_SQLStatement)._vptr_SQLStatement)->
        _vptr_BaseExpression[1])();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>_>_>
               *)local_f8);
    goto LAB_00cbfb8f;
  case 0xc:
  case 0xd:
    local_118._0_8_ = *(undefined8 *)(in_RDX + 0x18);
    optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGList,_true> *)local_118);
    if (((*(int *)((long)&(((ParsedExpression *)local_118._0_8_)->super_BaseExpression).
                          _vptr_BaseExpression + 4) != 2) ||
        (optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
                   ((optional_ptr<duckdb_libpgquery::PGList,_true> *)local_118),
        pPVar3 = *(ParserOptions **)(local_118._0_8_ + 8),
        lVar4._0_1_ = pPVar3->preserve_identifier_case, lVar4._1_1_ = pPVar3->integer_division,
        lVar4._2_6_ = *(undefined6 *)&pPVar3->field_0x2, lVar4 == 0)) ||
       (optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
                  ((optional_ptr<duckdb_libpgquery::PGList,_true> *)local_118),
       *(long *)(((string *)(local_118._0_8_ + 0x10))->_M_dataplus)._M_p == 0)) {
      this_03 = (InternalException *)__cxa_allocate_exception(0x10);
      local_d8._0_8_ = local_d8 + 0x10;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_d8,"(NOT) BETWEEN needs two args","");
      InternalException::InternalException(this_03,(string *)local_d8);
      __cxa_throw(this_03,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    TransformExpression((Transformer *)(local_118 + 8),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGList,_true> *)local_118);
    TransformExpression((Transformer *)(local_f8 + 0x18),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)root);
    optional_ptr<duckdb_libpgquery::PGList,_true>::CheckValid
              ((optional_ptr<duckdb_libpgquery::PGList,_true> *)local_118);
    TransformExpression((Transformer *)local_100,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root
                       );
    make_uniq<duckdb::BetweenExpression,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((duckdb *)&local_108,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_118 + 8),
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_f8 + 0x18),
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_100);
    _Var20._M_head_impl = local_108._M_head_impl;
    if (*(int *)(in_RDX + 4) == 0xc) {
      local_108._M_head_impl = (SelectStatement *)0x0;
    }
    else {
      _Var20._M_head_impl = (SelectStatement *)operator_new(0x50);
      local_d8._0_8_ = local_108._M_head_impl;
      local_108._M_head_impl = (SelectStatement *)0x0;
      local_f8._0_8_ = (_Head_base<0UL,_duckdb::ParsedExpression_*,_false>)0x0;
      OperatorExpression::OperatorExpression
                ((OperatorExpression *)_Var20._M_head_impl,OPERATOR_NOT,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_d8,
                 (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                  *)local_f8);
      if ((_Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
           )local_f8._0_8_ != (ParsedExpression *)0x0) {
        (**(code **)((long)*(unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
                             *)local_f8._0_8_ + 8))();
      }
      local_f8._0_8_ =
           (tuple<duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>)0x0;
      if ((Transformer *)local_d8._0_8_ != (Transformer *)0x0) {
        (*(((ParsedExpression *)local_d8._0_8_)->super_BaseExpression)._vptr_BaseExpression[1])();
      }
    }
    (this->parent).ptr = (Transformer *)_Var20._M_head_impl;
  }
  if ((Transformer *)local_108._M_head_impl != (Transformer *)0x0) {
    (*((BaseExpression *)&((local_108._M_head_impl)->super_SQLStatement)._vptr_SQLStatement)->
      _vptr_BaseExpression[1])();
  }
  if (local_100 != (undefined1  [8])0x0) {
    (*(code *)((__node_base_ptr)
              (((ParsedExpression *)local_100)->super_BaseExpression)._vptr_BaseExpression)[1].
              _M_nxt)();
  }
LAB_00cbfb8f:
  _Var22._M_head_impl = (ParsedExpression *)local_118._8_8_;
  if ((__buckets_ptr)local_f8._24_8_ != (__buckets_ptr)0x0) {
    (*(code *)(*(__node_base_ptr *)local_f8._24_8_)[1]._M_nxt)();
    _Var22._M_head_impl = (ParsedExpression *)local_118._8_8_;
  }
LAB_00cbfba4:
  if ((Transformer *)_Var22._M_head_impl != (Transformer *)0x0) {
    (*((BaseExpression *)&((_Var22._M_head_impl)->super_BaseExpression)._vptr_BaseExpression)->
      _vptr_BaseExpression[1])();
  }
LAB_00cbfbaf:
  if ((Transformer *)local_88._0_8_ != (Transformer *)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_);
  }
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformAExprInternal(duckdb_libpgquery::PGAExpr &root) {
	auto name = string(PGPointerCast<duckdb_libpgquery::PGValue>(root.name->head->data.ptr_value)->val.str);

	switch (root.kind) {
	case duckdb_libpgquery::PG_AEXPR_OP_ALL:
	case duckdb_libpgquery::PG_AEXPR_OP_ANY: {
		// left=ANY(right)
		// we turn this into left=ANY((SELECT UNNEST(right)))
		auto left_expr = TransformExpression(root.lexpr);
		auto right_expr = TransformExpression(root.rexpr);

		auto subquery_expr = make_uniq<SubqueryExpression>();
		auto select_statement = make_uniq<SelectStatement>();
		auto select_node = make_uniq<SelectNode>();
		vector<unique_ptr<ParsedExpression>> children;
		children.push_back(std::move(right_expr));

		select_node->select_list.push_back(make_uniq<FunctionExpression>("UNNEST", std::move(children)));
		select_node->from_table = make_uniq<EmptyTableRef>();
		select_statement->node = std::move(select_node);
		subquery_expr->subquery = std::move(select_statement);
		subquery_expr->subquery_type = SubqueryType::ANY;
		subquery_expr->child = std::move(left_expr);
		subquery_expr->comparison_type = OperatorToExpressionType(name);
		SetQueryLocation(*subquery_expr, root.location);
		if (subquery_expr->comparison_type == ExpressionType::INVALID) {
			throw ParserException("Unsupported comparison \"%s\" for ANY/ALL subquery", name);
		}

		if (root.kind == duckdb_libpgquery::PG_AEXPR_OP_ALL) {
			// ALL sublink is equivalent to NOT(ANY) with inverted comparison
			// e.g. [= ALL()] is equivalent to [NOT(<> ANY())]
			// first invert the comparison type
			subquery_expr->comparison_type = NegateComparisonExpression(subquery_expr->comparison_type);
			return make_uniq<OperatorExpression>(ExpressionType::OPERATOR_NOT, std::move(subquery_expr));
		}
		return std::move(subquery_expr);
	}
	case duckdb_libpgquery::PG_AEXPR_IN: {
		return TransformInExpression(name, root);
	}
	// rewrite NULLIF(a, b) into CASE WHEN a=b THEN NULL ELSE a END
	case duckdb_libpgquery::PG_AEXPR_NULLIF: {
		vector<unique_ptr<ParsedExpression>> children;
		children.push_back(TransformExpression(root.lexpr));
		children.push_back(TransformExpression(root.rexpr));
		return make_uniq<FunctionExpression>("nullif", std::move(children));
	}
	// rewrite (NOT) X BETWEEN A AND B into (NOT) AND(GREATERTHANOREQUALTO(X,
	// A), LESSTHANOREQUALTO(X, B))
	case duckdb_libpgquery::PG_AEXPR_BETWEEN:
	case duckdb_libpgquery::PG_AEXPR_NOT_BETWEEN: {
		auto between_args = PGPointerCast<duckdb_libpgquery::PGList>(root.rexpr);
		if (between_args->length != 2 || !between_args->head->data.ptr_value || !between_args->tail->data.ptr_value) {
			throw InternalException("(NOT) BETWEEN needs two args");
		}

		auto input = TransformExpression(root.lexpr);
		auto between_left =
		    TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(between_args->head->data.ptr_value));
		auto between_right =
		    TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(between_args->tail->data.ptr_value));

		auto compare_between =
		    make_uniq<BetweenExpression>(std::move(input), std::move(between_left), std::move(between_right));
		if (root.kind == duckdb_libpgquery::PG_AEXPR_BETWEEN) {
			return std::move(compare_between);
		} else {
			return make_uniq<OperatorExpression>(ExpressionType::OPERATOR_NOT, std::move(compare_between));
		}
	}
	// rewrite SIMILAR TO into regexp_full_match('asdf', '.*sd.*')
	case duckdb_libpgquery::PG_AEXPR_SIMILAR: {
		auto left_expr = TransformExpression(root.lexpr);
		auto right_expr = TransformExpression(root.rexpr);

		vector<unique_ptr<ParsedExpression>> children;
		children.push_back(std::move(left_expr));

		auto &similar_func = right_expr->Cast<FunctionExpression>();
		D_ASSERT(similar_func.function_name == "similar_escape");
		D_ASSERT(similar_func.children.size() == 2);
		if (similar_func.children[1]->GetExpressionType() != ExpressionType::VALUE_CONSTANT) {
			throw NotImplementedException("Custom escape in SIMILAR TO");
		}
		auto &constant = similar_func.children[1]->Cast<ConstantExpression>();
		if (!constant.value.IsNull()) {
			throw NotImplementedException("Custom escape in SIMILAR TO");
		}
		// take the child of the similar_func
		children.push_back(std::move(similar_func.children[0]));

		// this looks very odd, but seems to be the way to find out its NOT IN
		bool invert_similar = false;
		if (name == "!~") {
			// NOT SIMILAR TO
			invert_similar = true;
		}
		const auto regex_function = "regexp_full_match";
		auto result = make_uniq<FunctionExpression>(regex_function, std::move(children));

		if (invert_similar) {
			return make_uniq<OperatorExpression>(ExpressionType::OPERATOR_NOT, std::move(result));
		} else {
			return std::move(result);
		}
	}
	case duckdb_libpgquery::PG_AEXPR_NOT_DISTINCT: {
		auto left_expr = TransformExpression(root.lexpr);
		auto right_expr = TransformExpression(root.rexpr);
		return make_uniq<ComparisonExpression>(ExpressionType::COMPARE_NOT_DISTINCT_FROM, std::move(left_expr),
		                                       std::move(right_expr));
	}
	case duckdb_libpgquery::PG_AEXPR_DISTINCT: {
		auto left_expr = TransformExpression(root.lexpr);
		auto right_expr = TransformExpression(root.rexpr);
		return make_uniq<ComparisonExpression>(ExpressionType::COMPARE_DISTINCT_FROM, std::move(left_expr),
		                                       std::move(right_expr));
	}

	default:
		break;
	}
	auto left_expr = TransformExpression(root.lexpr);
	auto right_expr = TransformExpression(root.rexpr);

	if (!left_expr) {
		// prefix operator
		return TransformUnaryOperator(name, std::move(right_expr));
	} else if (!right_expr) {
		// postfix operator, only ! is currently supported
		return TransformUnaryOperator(name + "__postfix", std::move(left_expr));
	} else {
		return TransformBinaryOperator(std::move(name), std::move(left_expr), std::move(right_expr));
	}
}